

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGetShapeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  Result::Result((Result *)local_78);
  validateInputCount((Result *)local_50,layer,1,1);
  local_78 = local_50;
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_48);
  bVar2 = Result::good((Result *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  if (bVar2) {
    validateOutputCount((Result *)local_50,layer,1,1);
    local_78 = local_50;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_48);
    bVar2 = Result::good((Result *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
    if (bVar2) {
      Result::Result(__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p == &local_60) {
        return __return_storage_ptr__;
      }
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->m_type = local_78._0_4_;
  __return_storage_ptr__->m_reason = local_78._4_4_;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p == &local_60) {
    paVar1->_M_allocated_capacity = local_60._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_60._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_70._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         local_60._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_68;
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGetShapeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    return Result();
}